

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes2.cc
# Opt level: O2

void __thiscall Node::ScanOneMap(Node *this,VariableStruct *MapVar,int skipprefix)

{
  int iVar1;
  ostream *poVar2;
  VariableStruct NewVar;
  string local_80;
  string local_60;
  string local_40;
  
  iVar1 = this->Type;
  if ((((iVar1 - 0x110U < 0x40) &&
       ((0x8200000010080001U >> ((ulong)(iVar1 - 0x110U) & 0x3f) & 1) != 0)) ||
      ((iVar1 - 0x157U < 0x3b && ((0x400080000000101U >> ((ulong)(iVar1 - 0x157U) & 0x3f) & 1) != 0)
       ))) || ((iVar1 == 0x1a0 || (iVar1 == 0x1ba)))) {
LAB_00109288:
    std::__cxx11::string::string((string *)&local_60,(string *)&this->Tree[1]->TextValue);
    VariableStruct::VariableStruct(&NewVar,&local_60,VARTYPE_NONE,VARCLASS_MAP,1,0);
    std::__cxx11::string::~string((string *)&local_60);
    if (skipprefix == 0) {
      std::__cxx11::string::_M_assign((string *)&NewVar.Prefix);
    }
    VariableList::Append(Variables,&NewVar,0);
  }
  else if (iVar1 == 0x1d3) {
    std::__cxx11::string::string((string *)&local_40,(string *)&this->TextValue);
    VariableStruct::VariableStruct(&NewVar,&local_40,VARTYPE_NONE,VARCLASS_MAP,1,0);
    std::__cxx11::string::~string((string *)&local_40);
    if (skipprefix == 0) {
      std::__cxx11::string::_M_assign((string *)&NewVar.Prefix);
    }
    VariableList::Append(Variables,&NewVar,0);
  }
  else {
    if (iVar1 != 0x1d8) {
      if (iVar1 != 0x204) {
        if (iVar1 == 0x1f5) {
          if (this->Tree[0] != (Node *)0x0) {
            ScanOneMap(this->Tree[0],MapVar,skipprefix);
          }
          if (this->Tree[1] != (Node *)0x0) {
            ScanOneMap(this->Tree[1],MapVar,skipprefix);
          }
        }
        else {
          poVar2 = std::operator<<((ostream *)&std::cerr,"Undefined type ");
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->Type);
          poVar2 = std::operator<<(poVar2,"@");
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->lineno);
          std::endl<char,std::char_traits<char>>(poVar2);
        }
        goto LAB_001092f2;
      }
      goto LAB_00109288;
    }
    std::__cxx11::string::string((string *)&local_80,(string *)&this->Tree[0]->TextValue);
    VariableStruct::VariableStruct(&NewVar,&local_80,VARTYPE_NONE,VARCLASS_MAP,1,0);
    std::__cxx11::string::~string((string *)&local_80);
    if (skipprefix == 0) {
      std::__cxx11::string::_M_assign((string *)&NewVar.Prefix);
    }
    VariableList::Append(Variables,&NewVar,0);
  }
  VariableStruct::~VariableStruct(&NewVar);
LAB_001092f2:
  if (this->Block[0] != (Node *)0x0) {
    ScanOneMap(this->Block[0],MapVar,skipprefix);
  }
  return;
}

Assistant:

void Node::ScanOneMap(
	VariableStruct* MapVar,	/**< Main map variable */
	int skipprefix
)
{
	switch (Type)
	{
	case BAS_N_LIST:
 
		if (Tree[0] != 0)
		{
			Tree[0]->ScanOneMap(MapVar, skipprefix);
		}
		if (Tree[1] != 0)
		{
			Tree[1]->ScanOneMap(MapVar, skipprefix);
		}
		break;                                                                   
	case BAS_V_NAME:
 
		{
			VariableStruct NewVar(TextValue,
				VARTYPE_NONE, VARCLASS_MAP, true);
			if (!skipprefix)
			{
				NewVar.Prefix = MapVar->CName;
			}
			Variables->Append(NewVar);
		}
		break;
 
	case BAS_N_VARTYPE:
	case BAS_S_BYTE:
	case BAS_S_DOUBLE:
	case BAS_S_GFLOAT:
	case BAS_S_HFLOAT:
	case BAS_S_LONG:
	case BAS_S_WORD:
	case BAS_S_INTEGER:
	case BAS_S_REAL:
	case BAS_S_RFA:
	case BAS_S_STRING:
	case BAS_S_DECIMAL:
 
		{
			VariableStruct NewVar(Tree[1]->TextValue,
				VARTYPE_NONE, VARCLASS_MAP, true);
			if (!skipprefix)
			{
				NewVar.Prefix = MapVar->CName;
			}
			Variables->Append(NewVar);
		}
		break;
 
// FIXME: This is just to have something here, but it doesn't do
// the right thing yet
	case BAS_V_DEFINEVAR:
 
		{
			VariableStruct NewVar(Tree[0]->TextValue,
				VARTYPE_NONE, VARCLASS_MAP, true);
			if (!skipprefix)
			{
				NewVar.Prefix = MapVar->CName;
			}
			Variables->Append(NewVar);
		}
		break;
 
	default:
		std::cerr << "Undefined type " << Type << "@" << lineno << std::endl;
		break;
	}
 
	if (Block[0] != 0)
	{
		Block[0]->ScanOneMap(MapVar, skipprefix);
	}
}